

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::state::reset_tables(state *this)

{
  long in_RDI;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0xc; local_c = local_c + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x24 + (ulong)local_c * 2));
  }
  for (local_10 = 0; local_10 < 0xc; local_10 = local_10 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x3c + (ulong)local_10 * 2));
  }
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x54 + (ulong)local_14 * 2));
  }
  for (local_18 = 0; local_18 < 0xc; local_18 = local_18 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x6c + (ulong)local_18 * 2));
  }
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x84 + (ulong)local_1c * 2));
  }
  for (local_20 = 0; local_20 < 0xc; local_20 = local_20 + 1) {
    adaptive_bit_model::clear((adaptive_bit_model *)(in_RDI + 0x9c + (ulong)local_20 * 2));
  }
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    lzham::quasi_adaptive_huffman_data_model::reset();
    lzham::quasi_adaptive_huffman_data_model::reset();
  }
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  return;
}

Assistant:

void lzcompressor::state::reset_tables()
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++) 
         m_is_match_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep_model); i++) 
         m_is_rep_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_model); i++) 
         m_is_rep0_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_single_byte_model); i++) 
         m_is_rep0_single_byte_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep1_model); i++) 
         m_is_rep1_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep2_model); i++) 
         m_is_rep2_model[i].clear();

      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].reset();
         m_large_len_table[i].reset();
      }
      m_main_table.reset();
      m_dist_lsb_table.reset();

      m_lit_table.reset();
      m_delta_lit_table.reset();
   }